

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int set_comp_cast(lyxp_set *trg,lyxp_set *src,lyxp_set_type type,lyd_node *cur_node,
                 lys_module *param_5,uint32_t src_idx,int options)

{
  lyxp_set_node *plVar1;
  int iVar2;
  int iVar3;
  
  if (src->type == LYXP_SET_NODE_SET) {
    trg->ctx_pos = 0;
    trg->ctx_size = 0;
    *(undefined8 *)&trg->field_0x38 = 0;
    trg->used = 0;
    trg->size = 0;
    trg->ht = (hash_table *)0x0;
    (trg->val).nodes = (lyxp_set_node *)0x0;
    *(undefined8 *)((long)&trg->val + 8) = 0;
    *(undefined8 *)trg = 0;
    *(undefined8 *)&trg->field_0x8 = 0;
    plVar1 = (src->val).nodes;
    iVar3 = 0;
    set_insert_node(trg,plVar1[src_idx].node,plVar1[src_idx].pos,plVar1[src_idx].type,0);
    iVar2 = lyxp_set_cast(trg,type,cur_node,param_5,options);
    if (iVar2 != 0) {
      set_free_content(trg);
      iVar3 = -1;
    }
    return iVar3;
  }
  __assert_fail("src->type == LYXP_SET_NODE_SET",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                ,0x5a7,
                "int set_comp_cast(struct lyxp_set *, struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, uint32_t, int)"
               );
}

Assistant:

static int
set_comp_cast(struct lyxp_set *trg, struct lyxp_set *src, enum lyxp_set_type type, const struct lyd_node *cur_node,
              const struct lys_module *local_mod, uint32_t src_idx, int options)
{
    assert(src->type == LYXP_SET_NODE_SET);

    memset(trg, 0, sizeof *trg);

    /* insert node into target set */
    set_insert_node(trg, src->val.nodes[src_idx].node, src->val.nodes[src_idx].pos, src->val.nodes[src_idx].type, 0);

    /* cast target set appropriately */
    if (lyxp_set_cast(trg, type, cur_node, local_mod, options)) {
        set_free_content(trg);
        return -1;
    }

    return EXIT_SUCCESS;
}